

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

void recff_cdata_call(jit_State *J,RecordFFData *rd)

{
  CTSize *pCVar1;
  TRef *pTVar2;
  ushort uVar3;
  lua_State *plVar4;
  BCIns *pBVar5;
  TRef *pTVar6;
  TValue *pTVar7;
  TRef TVar8;
  IRType IVar9;
  TRef TVar10;
  uint uVar11;
  GCcdata *pGVar12;
  CTState *cts;
  cTValue *pcVar13;
  GCcdata GVar14;
  long lVar15;
  MMS mm;
  uint uVar16;
  lua_State *L;
  long lVar17;
  BCReg BVar18;
  CType *pCVar19;
  uint id;
  ulong uVar20;
  IRRef1 IVar21;
  CType *pCVar22;
  IRRef1 IVar23;
  TValue *base;
  CTState *cts_00;
  TValue *pTVar24;
  short sVar25;
  ulong uVar26;
  CType *pCVar27;
  bool bVar28;
  cTValue local_c0;
  TRef local_b8;
  TRef aTStack_b4 [33];
  
  cts_00 = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
  pGVar12 = argv2cdata(J,*J->base,rd->argv);
  uVar3 = pGVar12->ctypeid;
  uVar11 = (uint)uVar3;
  if (uVar11 == 0x15) {
    uVar11 = pGVar12[1].nextgc.gcptr32;
    crec_constructor(J,(GCcdata *)(ulong)uVar11,*J->base);
    mm = MM_new;
LAB_001590e1:
    uVar16 = cts_00->tab[uVar11].info;
    id = uVar16 & 0xffff;
    if ((uVar16 & 0xf0000000) != 0x20000000) {
      id = uVar11;
    }
    pcVar13 = lj_ctype_meta(cts_00,id,mm);
    if (pcVar13 == (cTValue *)0x0) {
      if (uVar3 == 0x15) {
        crec_alloc(J,rd,uVar11);
        return;
      }
    }
    else if ((pcVar13->field_2).it == 0xfffffff7) {
      TVar10 = lj_ir_kgc(J,(GCobj *)(ulong)(pcVar13->u32).lo,IRT_FUNC);
      J->base[-1] = TVar10 | 0x10000;
      rd->nres = -1;
      return;
    }
    lj_trace_err(J,LJ_TRERR_BADTYPE);
  }
  cts = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
  pCVar22 = cts->tab;
  uVar16 = pCVar22[uVar3].info;
  pCVar27 = pCVar22 + uVar3;
  if ((uVar16 & 0xf0000000) == 0x20000000) {
    pCVar1 = &pCVar27->size;
    uVar20 = (ulong)((uVar16 & 0xffff) << 4);
    uVar16 = *(uint *)((long)&pCVar22->info + uVar20);
    pCVar27 = (CType *)((long)&pCVar22->info + uVar20);
    sVar25 = (ushort)(*pCVar1 == 8) * 4 + 5;
  }
  else {
    sVar25 = 9;
  }
  mm = MM_call;
  if ((uVar16 & 0xf0000000) != 0x60000000) goto LAB_001590e1;
  TVar10 = *J->base;
  (J->fold).ins.field_0.ot = sVar25 + 0x4400;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
  (J->fold).ins.field_0.op2 = 0xf;
  TVar10 = lj_opt_fold(J);
  IVar21 = (IRRef1)TVar10;
  pCVar22 = cts->tab + (ushort)pCVar27->info;
  IVar9 = crec_ct2irt(cts,pCVar22);
  if (sVar25 == 9) {
    GVar14 = pGVar12[1];
  }
  else {
    GVar14.marked = '\0';
    GVar14.gct = '\0';
    GVar14.ctypeid = 0;
    GVar14.nextgc.gcptr32 = pGVar12[1].nextgc.gcptr32;
  }
  local_c0.u64 = (ulong)GVar14 >> 2;
  pcVar13 = lj_tab_get(J->L,cts->miscmap,&local_c0);
  if ((pcVar13->field_2).it == 0xfffffffd) {
    lj_trace_err(J,LJ_TRERR_BLACKL);
  }
  uVar11 = pCVar22->info >> 0x1c;
  if (uVar11 == 4) {
    rd->nres = 0;
    IVar9 = IRT_NIL;
  }
  else if (((uVar11 != 2 && 0xfffffff < pCVar22->info) && (uVar11 != 5)) || (IVar9 == IRT_CDATA))
  goto LAB_00159660;
  if ((pCVar27->info & 0x800000) != 0) {
    TVar10 = lj_ir_kint(J,(int32_t)((ulong)((long)pCVar27 - (long)cts->tab) >> 4));
    (J->fold).ins.field_0.ot = 0x6200;
    (J->fold).ins.field_0.op1 = IVar21;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
    TVar10 = lj_opt_fold(J);
    IVar21 = (IRRef1)TVar10;
  }
  uVar3 = (ushort)IVar9;
  local_b8 = 0x7fff;
  if (J->base[1] == 0) {
    TVar10 = 0x7fff;
  }
  else {
    pTVar24 = rd->argv;
    lVar17 = 0;
    uVar20 = (ulong)pCVar27->sib;
    pTVar6 = J->base;
    do {
      lVar15 = lVar17;
      if (lVar15 == 0x20) goto LAB_00159660;
      pTVar24 = pTVar24 + 1;
      if ((int)uVar20 == 0) {
        if ((pCVar27->info & 0x800000) == 0) goto LAB_00159660;
        uVar11 = lj_ccall_ctid_vararg(cts,pTVar24);
        pCVar19 = cts->tab;
        uVar26 = 0;
      }
      else {
        pCVar19 = cts->tab;
        uVar26 = (ulong)pCVar19[uVar20].sib;
        uVar11 = (uint)(ushort)pCVar19[uVar20].info;
      }
      if (((0xfffffff < pCVar19[uVar11].info) &&
          (uVar16 = pCVar19[uVar11].info >> 0x1c, uVar16 != 2)) && (uVar16 != 5)) goto LAB_00159660;
      pCVar19 = pCVar19 + uVar11;
      TVar10 = crec_ct_tv(J,pCVar19,0,pTVar6[1],pTVar24);
      uVar11 = pCVar19->info;
      if (((uVar11 & 0xf4000000) == 0) && (pCVar19->size < 4)) {
        bVar28 = pCVar19->size != 1;
        (J->fold).ins.field_0.ot = 0x5913;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
        IVar23 = bVar28 + 0x270 + (ushort)bVar28;
        if ((uVar11 >> 0x17 & 1) == 0) {
          IVar23 = bVar28 + 0xa6f + (ushort)bVar28;
        }
        (J->fold).ins.field_0.op2 = IVar23;
        TVar10 = lj_opt_fold(J);
      }
      aTStack_b4[lVar15 + -1] = TVar10;
      pTVar2 = pTVar6 + 2;
      lVar17 = lVar15 + 1;
      uVar20 = uVar26;
      pTVar6 = pTVar6 + 1;
    } while (*pTVar2 != 0);
    TVar10 = local_b8;
    if (lVar15 != 0) {
      lVar17 = 0;
      do {
        TVar8 = aTStack_b4[lVar17];
        (J->fold).ins.field_0.ot = 0x6200;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
        TVar10 = lj_opt_fold(J);
        lVar17 = lVar17 + 1;
      } while (lVar15 != lVar17);
    }
  }
  (J->fold).ins.field_0.ot = uVar3 | 0x6100;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
  (J->fold).ins.field_0.op2 = IVar21;
  TVar10 = lj_opt_fold(J);
  IVar21 = (IRRef1)TVar10;
  if ((pCVar22->info & 0xf8000000) == 0x8000000) {
    plVar4 = J->L;
    pTVar24 = plVar4->base;
    uVar11 = *(uint *)((long)pTVar24 + -4);
    if ((uVar11 & 3) != 0) {
LAB_00159660:
      lj_trace_err(J,LJ_TRERR_NYICALL);
    }
    uVar16 = ((BCIns *)(ulong)uVar11)[-1];
    TVar10 = 0x7fff;
    if ((uVar16 & 0xff000000) != 0x1000000) {
      if (J->framedepth < 1) goto LAB_00159660;
      pBVar5 = J->pc;
      pTVar6 = J->base;
      TVar10 = pTVar6[-1];
      pTVar7 = plVar4->top;
      J->pc = (BCIns *)(ulong)uVar11;
      uVar11 = uVar16 >> 8 & 0xff;
      plVar4->top = pTVar24;
      uVar20 = (ulong)(uVar11 * 4 + 4);
      BVar18 = uVar11 + 1;
      plVar4->base = (TValue *)((long)pTVar24 - (ulong)(uVar11 * 8 + 8));
      pTVar6[-1] = 0x1007ffe;
      J->base = (TRef *)((long)pTVar6 - uVar20);
      J->baseslot = J->baseslot - BVar18;
      J->maxslot = BVar18;
      J->framedepth = J->framedepth + -1;
      lj_snap_add(J);
      plVar4->base = pTVar24;
      plVar4->top = pTVar7;
      J->framedepth = J->framedepth + 1;
      J->maxslot = 1;
      pTVar6 = J->base;
      J->base = (TRef *)((long)pTVar6 + uVar20);
      J->baseslot = J->baseslot + BVar18;
      *(TRef *)((long)pTVar6 + (uVar20 - 4)) = TVar10;
      J->pc = pBVar5;
      TVar10 = lj_ir_kint(J,0);
      (J->fold).ins.field_0.ot = 0x990;
      (J->fold).ins.field_0.op1 = IVar21;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
      J->postproc = LJ_POST_FIXGUARDSNAP;
      TVar10 = 0x2007ffd;
    }
    goto LAB_001595bf;
  }
  if (((IVar9 < IRT_SOFTFP) && ((0x600220U >> (IVar9 & IRT_TYPE) & 1) != 0)) ||
     ((pCVar22->info & 0xf0000000) == 0x50000000)) {
    TVar10 = lj_ir_kint(J,(uint)(ushort)pCVar27->info);
    (J->fold).ins.field_0.ot = 0x528a;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
    (J->fold).ins.field_0.op2 = IVar21;
  }
  else {
    switch(IVar9) {
    case IRT_FLOAT:
    case IRT_U32:
      IVar23 = uVar3 | 0x1c0;
      (J->fold).ins.field_0.ot = 0x590e;
      goto LAB_0015962b;
    default:
      if ((IVar9 & ~IRT_TRUE) != IRT_U8) goto LAB_001595bf;
      IVar23 = uVar3 | 0x260;
      break;
    case IRT_I8:
    case IRT_I16:
      IVar23 = uVar3 | 0xa60;
    }
    (J->fold).ins.field_0.ot = 0x5913;
LAB_0015962b:
    (J->fold).ins.field_0.op1 = IVar21;
    (J->fold).ins.field_0.op2 = IVar23;
  }
  TVar10 = lj_opt_fold(J);
LAB_001595bf:
  *J->base = TVar10;
  J->needsnap = '\x01';
  return;
}

Assistant:

void LJ_FASTCALL recff_cdata_call(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  GCcdata *cd = argv2cdata(J, J->base[0], &rd->argv[0]);
  CTypeID id = cd->ctypeid;
  CType *ct;
  cTValue *tv;
  MMS mm = MM_call;
  if (id == CTID_CTYPEID) {
    id = crec_constructor(J, cd, J->base[0]);
    mm = MM_new;
  } else if (crec_call(J, rd, cd)) {
    return;
  }
  /* Record ctype __call/__new metamethod. */
  ct = ctype_raw(cts, id);
  tv = lj_ctype_meta(cts, ctype_isptr(ct->info) ? ctype_cid(ct->info) : id, mm);
  if (tv) {
    if (tvisfunc(tv)) {
      crec_tailcall(J, rd, tv);
      return;
    }
  } else if (mm == MM_new) {
    crec_alloc(J, rd, id);
    return;
  }
  /* No metamethod or NYI: non-function metamethods. */
  lj_trace_err(J, LJ_TRERR_BADTYPE);
}